

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_print_integer.c
# Opt level: O3

void intformat(intmax_t value,_PDCLIB_status_t *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char preface [3];
  undefined2 local_2c;
  undefined1 local_2a;
  
  local_2a = 0;
  local_2c = 0;
  if (status->prec < 0) {
    status->prec = 1;
  }
  uVar1 = status->flags;
  if ((uVar1 & 4) == 0) {
LAB_0010a5f1:
    lVar7 = 0;
LAB_0010a5f3:
    if (-1 < value) goto LAB_0010a5f8;
    *(undefined1 *)((long)&local_2c + lVar7) = 0x2d;
  }
  else {
    if (status->base != 0x10) {
      if (value == 0 || status->base != 8) goto LAB_0010a5f1;
      local_2c = 0x30;
      lVar7 = 1;
      goto LAB_0010a5f3;
    }
    if (value != 0) {
      local_2c = CONCAT11(((byte)(uVar1 >> 0x10) & 1) << 5,0x30) | 0x5800;
      lVar7 = 2;
      goto LAB_0010a5f3;
    }
    lVar7 = 0;
LAB_0010a5f8:
    if ((uVar1 >> 0x11 & 1) != 0) goto LAB_0010a666;
    if ((uVar1 & 2) == 0) {
      if ((uVar1 & 8) == 0) goto LAB_0010a666;
      *(undefined1 *)((long)&local_2c + lVar7) = 0x20;
    }
    else {
      *(undefined1 *)((long)&local_2c + lVar7) = 0x2b;
    }
  }
  lVar7 = lVar7 + 1;
LAB_0010a666:
  uVar10 = (ulong)status->prec;
  uVar4 = status->current;
  uVar5 = uVar4;
  if ((uVar1 & 0x11) == 0) {
    uVar3 = uVar10;
    if (uVar10 < uVar4) {
      uVar3 = uVar4;
    }
    if (uVar3 + lVar7 < status->width) {
      uVar2 = status->i;
      uVar9 = 0;
      do {
        if (uVar2 < status->n) {
          if ((FILE *)status->stream == (FILE *)0x0) {
            status->s[uVar2] = ' ';
          }
          else {
            putc(0x20,(FILE *)status->stream);
          }
        }
        uVar2 = status->i + 1;
        status->i = uVar2;
        uVar5 = status->current + 1;
        status->current = uVar5;
        uVar9 = uVar9 + 1;
      } while (uVar9 < status->width - (uVar3 + lVar7));
    }
  }
  if ((char)local_2c != '\0') {
    uVar3 = status->i;
    pcVar8 = (char *)((long)&local_2c + 1);
    cVar6 = (char)local_2c;
    do {
      if (uVar3 < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[uVar3] = cVar6;
        }
        else {
          putc((int)cVar6,(FILE *)status->stream);
        }
      }
      uVar3 = status->i + 1;
      status->i = uVar3;
      uVar5 = status->current + 1;
      status->current = uVar5;
      cVar6 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar6 != '\0');
  }
  if (uVar4 < uVar10) {
    uVar3 = status->i;
    if (uVar4 >= uVar10) {
      uVar4 = uVar10;
    }
    lVar7 = uVar4 - uVar10;
    do {
      if (uVar3 < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[uVar3] = '0';
        }
        else {
          putc(0x30,(FILE *)status->stream);
        }
      }
      uVar3 = status->i + 1;
      status->i = uVar3;
      uVar5 = status->current + 1;
      status->current = uVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  if (((status->flags & 0x11U) == 0x10) && (uVar5 < status->width)) {
    uVar4 = status->i;
    do {
      if (uVar4 < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[uVar4] = '0';
        }
        else {
          putc(0x30,(FILE *)status->stream);
        }
      }
      uVar4 = status->i + 1;
      status->i = uVar4;
      uVar5 = status->current + 1;
      status->current = uVar5;
    } while (uVar5 < status->width);
  }
  return;
}

Assistant:

static void intformat( intmax_t value, struct _PDCLIB_status_t * status )
{
    /* At worst, we need two prefix characters (hex prefix). */
    char preface[3] = "\0";
    size_t preidx = 0;

    if ( status->prec < 0 )
    {
        status->prec = 1;
    }

    if ( ( status->flags & E_alt ) && ( status->base == 16 || status->base == 8 ) && ( value != 0 ) )
    {
        /* Octal / hexadecimal prefix for "%#" conversions */
        preface[ preidx++ ] = '0';

        if ( status->base == 16 )
        {
            preface[ preidx++ ] = ( status->flags & E_lower ) ? 'x' : 'X';
        }
    }

    if ( value < 0 )
    {
        /* Negative sign for negative values - at all times. */
        preface[ preidx++ ] = '-';
    }
    else if ( !( status->flags & E_unsigned ) )
    {
        /* plus sign / extra space are only for signed conversions */
        if ( status->flags & E_plus )
        {
            preface[ preidx++ ] = '+';
        }
        else
        {
            if ( status->flags & E_space )
            {
                preface[ preidx++ ] = ' ';
            }
        }
    }

    {
        /* At this point, status->current has the number of digits queued up.
           Determine if we have a precision requirement to pad those.
        */
        size_t prec_pads = ( ( _PDCLIB_size_t )status->prec > status->current ) ? ( ( _PDCLIB_size_t )status->prec - status->current ) : 0;

        if ( !( status->flags & ( E_minus | E_zero ) ) )
        {
            /* Space padding is only done if no zero padding or left alignment
               is requested. Calculate the number of characters that WILL be
               printed, including any prefixes determined above.
            */
            /* The number of characters to be printed, plus prefixes if any. */
            /* This line contained probably the most stupid, time-wasting bug
               I've ever perpetrated. Greetings to Samface, DevL, and all
               sceners at Breakpoint 2006.
            */
            size_t characters = preidx + ( ( status->current > ( _PDCLIB_size_t )status->prec ) ? status->current : ( _PDCLIB_size_t )status->prec );

            if ( status->width > characters )
            {
                size_t i;

                for ( i = 0; i < status->width - characters; ++i )
                {
                    PUT( ' ' );
                    ++( status->current );
                }
            }
        }

        /* Now we did the padding, do the prefixes (if any). */
        preidx = 0;

        while ( preface[ preidx ] != '\0' )
        {
            PUT( preface[ preidx++ ] );
            ++( status->current );
        }

        /* Do the precision padding if necessary. */
        while ( prec_pads-- > 0 )
        {
            PUT( '0' );
            ++( status->current );
        }

        if ( ( !( status->flags & E_minus ) ) && ( status->flags & E_zero ) )
        {
            /* If field is not left aligned, and zero padding is requested, do
               so.
            */
            while ( status->current < status->width )
            {
                PUT( '0' );
                ++( status->current );
            }
        }
    }
}